

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astDataType *
build_function_datatype
          (Context_conflict *ctx,MOJOSHADER_astDataType *rettype,int paramcount,
          MOJOSHADER_astDataType **params,int intrinsic)

{
  int iVar1;
  MOJOSHADER_astDataType *dt;
  void *ptr;
  MOJOSHADER_astDataType **dtparams;
  MOJOSHADER_astDataType **ppMStack_30;
  int intrinsic_local;
  MOJOSHADER_astDataType **params_local;
  MOJOSHADER_astDataType *pMStack_20;
  int paramcount_local;
  MOJOSHADER_astDataType *rettype_local;
  Context_conflict *ctx_local;
  
  ptr = (void *)0x0;
  dtparams._4_4_ = intrinsic;
  ppMStack_30 = params;
  params_local._4_4_ = paramcount;
  pMStack_20 = rettype;
  rettype_local = (MOJOSHADER_astDataType *)ctx;
  if (0 < paramcount) {
    dt = (MOJOSHADER_astDataType *)Malloc(ctx,(long)paramcount << 3);
    if (dt == (MOJOSHADER_astDataType *)0x0) {
      return (MOJOSHADER_astDataType *)0x0;
    }
    iVar1 = buffer_append(*(Buffer **)((long)rettype_local + 0x3b8),&dt,8);
    if (iVar1 == 0) {
      Free((Context_conflict *)&rettype_local->array,dt);
      return (MOJOSHADER_astDataType *)0x0;
    }
    ptr = dt;
    memcpy(dt,ppMStack_30,(long)params_local._4_4_ << 3);
  }
  dt = (MOJOSHADER_astDataType *)Malloc((Context_conflict *)&rettype_local->array,0x20);
  if (dt == (MOJOSHADER_astDataType *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    iVar1 = buffer_append(*(Buffer **)((long)rettype_local + 0x3b8),&dt,8);
    if (iVar1 == 0) {
      Free((Context_conflict *)&rettype_local->array,dt);
      ctx_local = (Context_conflict *)0x0;
    }
    else {
      dt->type = MOJOSHADER_AST_DATATYPE_FUNCTION;
      (dt->array).base = pMStack_20;
      (dt->user).name = (char *)ptr;
      (dt->function).num_params = params_local._4_4_;
      (dt->function).intrinsic = dtparams._4_4_;
      ctx_local = (Context_conflict *)&dt->array;
    }
  }
  return (MOJOSHADER_astDataType *)ctx_local;
}

Assistant:

static const MOJOSHADER_astDataType *build_function_datatype(Context *ctx,
                                        const MOJOSHADER_astDataType *rettype,
                                        const int paramcount,
                                        const MOJOSHADER_astDataType **params,
                                        const int intrinsic)
{
    const MOJOSHADER_astDataType **dtparams = NULL;
    void *ptr;

    if (paramcount > 0)
    {
        // !!! FIXME: this is hacky.
        ptr = Malloc(ctx, sizeof (*params) * paramcount);
        if (ptr == NULL)
            return NULL;
        if (!buffer_append(ctx->garbage, &ptr, sizeof (ptr)))
        {
            Free(ctx, ptr);
            return NULL;
        } // if
        dtparams = (const MOJOSHADER_astDataType **) ptr;
        memcpy(dtparams, params, sizeof (*params) * paramcount);
    }

    ptr = Malloc(ctx, sizeof (MOJOSHADER_astDataType));
    if (ptr == NULL)
        return NULL;
    if (!buffer_append(ctx->garbage, &ptr, sizeof (ptr)))
    {
        Free(ctx, ptr);
        return NULL;
    } // if

    MOJOSHADER_astDataType *dt = (MOJOSHADER_astDataType *) ptr;
    dt->type = MOJOSHADER_AST_DATATYPE_FUNCTION;
    dt->function.retval = rettype;
    dt->function.params = dtparams;
    dt->function.num_params = paramcount;
    dt->function.intrinsic = intrinsic;
    return dt;
}